

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O1

void redirect_duplicated_labels
               (MIR_context_t ctx,VARR_MIR_insn_t *labels,VARR_MIR_insn_t *branch_insns)

{
  MIR_insn_t_conflict pMVar1;
  MIR_func_t name;
  MIR_func_t func;
  long *plVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  long lVar7;
  gen_ctx *pgVar8;
  VARR_MIR_var_t *pVVar9;
  reg_desc_t *prVar10;
  MIR_lref_data *pMVar11;
  undefined8 *puVar12;
  long lVar13;
  size_t sVar14;
  DLIST_MIR_insn_t DVar15;
  size_t sStack_40;
  
LAB_001387d0:
  if (labels == (VARR_MIR_insn_t *)0x0) {
    redirect_duplicated_labels_cold_4();
LAB_00138892:
    redirect_duplicated_labels_cold_1();
  }
  else {
    sVar14 = labels->els_num;
    if (sVar14 != 0) {
      if (labels->varr != (MIR_insn_t_conflict *)0x0) {
        labels->els_num = sVar14 - 1;
        pMVar1 = labels->varr[sVar14 - 1];
        uVar6 = *(ulong *)&pMVar1->field_0x18;
        iVar3 = (int)uVar6;
        if (iVar3 != 0xa5) goto code_r0x00138805;
        uVar6 = 2;
        goto LAB_0013881e;
      }
      goto LAB_00138892;
    }
    if (ctx == (MIR_context_t)0x0) goto LAB_00138886;
    pgVar8 = ctx->gen_ctx;
    while( true ) {
      pgVar8 = (gen_ctx *)((long)&pgVar8[-1].spot_attrs + 7);
      if (pgVar8 == (gen_ctx *)0xffffffffffffffff) {
        return;
      }
      if (ctx->error_func == (MIR_error_func_t)0x0) break;
      ctx->gen_ctx = pgVar8;
      **(undefined8 **)(ctx->error_func + (long)pgVar8 * 8) = 0;
      if (ctx == (MIR_context_t)0x0) {
LAB_00138886:
        redirect_duplicated_labels_cold_3();
        return;
      }
    }
  }
  redirect_duplicated_labels_cold_2();
  if (((MIR_item_t_conflict)labels == (MIR_item_t_conflict)0x0) ||
     (((MIR_item_t_conflict)labels)->item_type != MIR_func_item)) {
LAB_00138a3b:
    __assert_fail("func_item != ((void*)0) && func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xac9,"void _MIR_restore_func_insns(MIR_context_t, MIR_item_t)");
  }
  name = (((MIR_item_t_conflict)labels)->u).func;
  pVVar9 = name->vars;
  if (pVVar9 != (VARR_MIR_var_t *)0x0) {
    do {
      uVar6 = pVVar9->els_num;
      if (uVar6 <= name->original_vars_num) goto LAB_00138983;
      func = (MIR_func_t)pVVar9->varr;
      if (func == (MIR_func_t)0x0) {
LAB_00138a36:
        _MIR_restore_func_insns_cold_2();
        goto LAB_00138a3b;
      }
      pVVar9->els_num = uVar6 - 1;
      plVar2 = (long *)name->internal;
      prVar10 = find_rd_by_name(*(MIR_context_t *)((long)func + uVar6 * 0x18 + -0x10),(char *)name,
                                func);
      if (prVar10 == (reg_desc_t *)0x0) {
        __assert_fail("rd != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0xad3,"void _MIR_restore_func_insns(MIR_context_t, MIR_item_t)");
      }
      if (*plVar2 == 0) {
        _MIR_restore_func_insns_cold_1();
        goto LAB_00138a36;
      }
      sVar14 = ((long)prVar10 - *(long *)(*plVar2 + 0x10) >> 3) * -0x5555555555555555;
      uVar4 = HTAB_size_t_do((HTAB_size_t *)plVar2[1],sVar14,HTAB_DELETE,&sStack_40);
      uVar5 = HTAB_size_t_do((HTAB_size_t *)plVar2[3],sVar14,HTAB_DELETE,&sStack_40);
      if ((uVar5 & uVar4) == 0) {
        __assert_fail("res_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0xad7,"void _MIR_restore_func_insns(MIR_context_t, MIR_item_t)");
      }
      pVVar9 = name->vars;
    } while (pVVar9 != (VARR_MIR_var_t *)0x0);
  }
  _MIR_restore_func_insns_cold_3();
LAB_00138983:
  pMVar1 = (name->insns).head;
  while (pMVar1 != (MIR_insn_t_conflict)0x0) {
    remove_insn(ctx,(MIR_item_t_conflict)labels,pMVar1,
                &((((MIR_item_t_conflict)labels)->u).func)->insns);
    pMVar1 = (name->insns).head;
  }
  pMVar1 = (name->original_insns).tail;
  (name->insns).head = (name->original_insns).head;
  (name->insns).tail = pMVar1;
  DVar15 = (DLIST_MIR_insn_t)(ZEXT816(0) << 0x20);
  name->original_insns = DVar15;
  for (pMVar11 = name->first_lref; pMVar11 != (MIR_lref_data *)0x0; pMVar11 = pMVar11->next) {
    pMVar11->label = pMVar11->orig_label;
    pMVar11->label2 = pMVar11->orig_label2;
    pMVar11->orig_label = DVar15.head;
    pMVar11->orig_label2 = DVar15.tail;
  }
  return;
code_r0x00138805:
  if (iVar3 != 0xa6) {
    if (iVar3 == 0xaa) {
      uVar6 = uVar6 >> 0x20;
LAB_0013881e:
      lVar13 = 1;
    }
    else {
      uVar6 = 1;
      lVar13 = 0;
    }
    if ((uint)lVar13 < (uint)uVar6) {
      lVar7 = uVar6 - lVar13;
      puVar12 = (undefined8 *)((long)&pMVar1->ops[0].u + (ulong)((uint)lVar13 * 0x30));
      do {
        *puVar12 = *(undefined8 *)*puVar12;
        puVar12 = puVar12 + 6;
        lVar7 = lVar7 + -1;
      } while (lVar7 != 0);
    }
  }
  goto LAB_001387d0;
}

Assistant:

static void redirect_duplicated_labels (MIR_context_t ctx MIR_UNUSED, VARR (MIR_insn_t) * labels,
                                        VARR (MIR_insn_t) * branch_insns) {
  MIR_insn_t insn;

  while (VARR_LENGTH (MIR_insn_t, branch_insns) != 0) { /* redirect new label operands */
    size_t start_label_nop = 0, bound_label_nop = 1, n;

    insn = VARR_POP (MIR_insn_t, branch_insns);
    if (insn->code == MIR_JMPI) continue;
    if (insn->code == MIR_SWITCH) {
      start_label_nop = 1;
      bound_label_nop = start_label_nop + insn->nops - 1;
    } else if (insn->code == MIR_LADDR) {
      start_label_nop = 1;
      bound_label_nop = 2;
    }
    for (n = start_label_nop; n < bound_label_nop; n++)
      insn->ops[n].u.label = insn->ops[n].u.label->data;
  }
  while (VARR_LENGTH (MIR_insn_t, labels) != 0) { /* reset data */
    insn = VARR_POP (MIR_insn_t, labels);
    insn->data = NULL;
  }
}